

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

GradleBuildConfigs * gradleBuildConfigs(GradleBuildConfigs *__return_storage_ptr__,QString *path)

{
  Data *pDVar1;
  char16_t *pcVar2;
  char cVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  qsizetype qVar8;
  long lVar9;
  QChar QVar10;
  QByteArray *line;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  QByteArrayView bv_02;
  QArrayDataPointer<char> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char> local_a8;
  QArrayDataPointer<QByteArray> local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)&__return_storage_ptr__->usesIntegerCompileSdkVersion = 0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->appNamespace).d.d = (Data *)0x0;
  (__return_storage_ptr__->appNamespace).d.ptr = (char16_t *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->appNamespace).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->appNamespace).d.size + 1) = 0;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  uStack_60 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_68,(QString *)path);
  cVar3 = QFile::open((QFile *)&local_68,1);
  if (cVar3 != '\0') {
    local_88.size = -0x5555555555555556;
    local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    QByteArray::split((char)&local_88);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    for (lVar9 = local_88.size * 0x18; lVar9 != 0; lVar9 = lVar9 + -0x18) {
      local_a8.size = -0x5555555555555556;
      local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_a8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      QByteArray::trimmed_helper((QByteArray *)&local_a8);
      qVar8 = QByteArrayView::lengthHelperCharArray("//",3);
      bv.m_data = "//";
      bv.m_size = qVar8;
      bVar4 = QByteArray::startsWith((QByteArray *)&local_a8,bv);
      if ((!bVar4) && ((local_a8.size == 0 || (*local_a8.ptr != '*')))) {
        qVar8 = QByteArrayView::lengthHelperCharArray("/*",3);
        bv_00.m_data = "/*";
        bv_00.m_size = qVar8;
        bVar4 = QByteArray::startsWith((QByteArray *)&local_a8,bv_00);
        if (!bVar4) {
          qVar8 = QByteArrayView::lengthHelperCharArray
                            ("compileSdkVersion androidCompileSdkVersion.toInteger()",0x37);
          bv_01.m_data = "compileSdkVersion androidCompileSdkVersion.toInteger()";
          bv_01.m_size = qVar8;
          bVar4 = QByteArray::contains((QByteArray *)&local_a8,bv_01);
          if (bVar4) {
            __return_storage_ptr__->usesIntegerCompileSdkVersion = true;
          }
          else {
            qVar8 = QByteArrayView::lengthHelperCharArray("namespace",10);
            bv_02.m_data = "namespace";
            bv_02.m_size = qVar8;
            bVar4 = QByteArray::contains((QByteArray *)&local_a8,bv_02);
            if (bVar4) {
              local_c8.size = -0x5555555555555556;
              local_c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              qVar8 = QByteArray::indexOf((QByteArray *)&local_a8,'=',0);
              iVar7 = (int)qVar8;
              if (iVar7 == -1) {
                qVar8 = QByteArray::indexOf((QByteArray *)&local_a8,' ',0);
                iVar7 = (int)qVar8;
              }
              if (iVar7 < 0) {
                local_e8.d = (Data *)0x0;
                local_e8.ptr = (char *)0x0;
                local_e8.size = 0;
              }
              else {
                QByteArray::mid((longlong)&local_58,(longlong)&local_a8);
                QByteArray::trimmed_helper((QByteArray *)&local_e8);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
              }
              QString::fromUtf8<void>((QString *)&local_c8,(QByteArray *)&local_e8);
              QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
              QVar10.ucs = (char16_t)&local_c8;
              cVar3 = QString::startsWith(QVar10,0x27);
              if (cVar3 == '\0') {
                bVar5 = 0;
              }
              else {
                bVar5 = QString::endsWith(QVar10,0x27);
              }
              cVar3 = QString::startsWith(QVar10,0x22);
              if (cVar3 == '\0') {
                bVar6 = 0;
              }
              else {
                bVar6 = QString::endsWith((QChar)(char16_t)&local_c8,0x22);
              }
              if ((bVar5 | bVar6) == 1) {
                QString::mid((longlong)&local_58,(longlong)&local_c8);
                pDVar1 = (__return_storage_ptr__->appNamespace).d.d;
                pcVar2 = (__return_storage_ptr__->appNamespace).d.ptr;
                (__return_storage_ptr__->appNamespace).d.d = local_58.d;
                (__return_storage_ptr__->appNamespace).d.ptr = local_58.ptr;
                qVar8 = (__return_storage_ptr__->appNamespace).d.size;
                (__return_storage_ptr__->appNamespace).d.size = local_58.size;
                local_58.d = pDVar1;
                local_58.ptr = pcVar2;
                local_58.size = qVar8;
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
              }
              else {
                QString::operator=(&__return_storage_ptr__->appNamespace,(QString *)&local_c8);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
            }
          }
        }
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_88);
  }
  QFile::~QFile((QFile *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

GradleBuildConfigs gradleBuildConfigs(const QString &path)
{
    GradleBuildConfigs configs;

    QFile file(path);
    if (!file.open(QIODevice::ReadOnly))
        return configs;

    auto isComment = [](const QByteArray &trimmed) {
        return trimmed.startsWith("//") || trimmed.startsWith('*') || trimmed.startsWith("/*");
    };

    auto extractValue = [](const QByteArray &trimmed) {
        int idx = trimmed.indexOf('=');

        if (idx == -1)
            idx = trimmed.indexOf(' ');

        if (idx > -1)
            return trimmed.mid(idx + 1).trimmed();

        return QByteArray();
    };

    const auto lines = file.readAll().split('\n');
    for (const auto &line : lines) {
        const QByteArray trimmedLine = line.trimmed();
        if (isComment(trimmedLine))
            continue;
        if (trimmedLine.contains("compileSdkVersion androidCompileSdkVersion.toInteger()")) {
            configs.usesIntegerCompileSdkVersion = true;
        } else if (trimmedLine.contains("namespace")) {
            const QString value = QString::fromUtf8(extractValue(trimmedLine));
            const bool singleQuoted = value.startsWith(u'\'') && value.endsWith(u'\'');
            const bool doubleQuoted = value.startsWith(u'\"') && value.endsWith(u'\"');

            if (singleQuoted || doubleQuoted)
                configs.appNamespace = value.mid(1, value.length() - 2);
            else
                configs.appNamespace = value;
        }
    }

    return configs;
}